

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMMSegment.hpp
# Opt level: O3

bool __thiscall CppJieba::HMMSegment::_decodeOne(HMMSegment *this,string *str,uint16_t *res)

{
  bool bVar1;
  Unicode ui16;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_28;
  
  local_28.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (uint16_t *)0x0;
  local_28.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = Limonp::utf8ToUnicode((str->_M_dataplus)._M_p,(uint)str->_M_string_length,&local_28);
  if ((bVar1) &&
     ((long)local_28.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_28.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start == 2)) {
    *res = *local_28.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start;
    bVar1 = true;
  }
  else {
    bVar1 = false;
    if (local_28.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start == (uint16_t *)0x0) {
      return false;
    }
  }
  operator_delete(local_28.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_start);
  return bVar1;
}

Assistant:

bool _decodeOne(const string& str, uint16_t& res)
            {
                Unicode ui16;
                if(!TransCode::decode(str, ui16) || ui16.size() != 1)
                {
                    return false;
                }
                res = ui16[0];
                return true;
            }